

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_allocator_std_impl.c
# Opt level: O2

memory_allocator_iface memory_allocator_std_iface(void)

{
  return &memory_allocator_std_iface::allocator_std_iface;
}

Assistant:

memory_allocator_iface memory_allocator_std_iface(void)
{
	static struct memory_allocator_iface_type allocator_std_iface = {
		&memory_allocator_std_create,
		&memory_allocator_std_allocate,
		&memory_allocator_std_reallocate,
		&memory_allocator_std_deallocate,
		&memory_allocator_std_destroy
	};

	return &allocator_std_iface;
}